

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O0

bool_t beltHashStepV(octet *hash,void *state)

{
  bool_t bVar1;
  void *in_RSI;
  void *in_RDI;
  belt_hash_st *st;
  
  beltHashStepG_internal(in_RSI);
  bVar1 = memEq(in_RDI,(void *)((long)in_RSI + 0x50),0x20);
  return bVar1;
}

Assistant:

bool_t beltHashStepV(const octet hash[32], void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	ASSERT(memIsValid(hash, 32));
	beltHashStepG_internal(state);
#if (OCTET_ORDER == BIG_ENDIAN)
	beltBlockRevU32(st->h1);
	beltBlockRevU32(st->h1 + 4);
#endif
	return memEq(hash, st->h1, 32);
}